

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardHeader::paintEvent(QWizardHeader *this,QPaintEvent *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  QPalette *pQVar6;
  long in_FS_OFFSET;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 *local_58;
  QWizardHeader *pQStack_50;
  QStyle *local_48;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QWizardHeader *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_58);
  pQStack_50 = this;
  local_48 = QWidget::style(&this->super_QWidget);
  QPainter::begin((QPaintDevice *)&local_58);
  QPainter::setRenderHint((RenderHint)(QColor *)&local_58,true);
  local_38 = 0;
  iStack_34 = 0;
  iStack_30 = 0;
  iStack_2c = 0;
  QPainter::drawPixmap((QPointF *)&local_58,(QPixmap *)&local_38);
  pQVar5 = (this->super_QWidget).data;
  uVar1 = (pQVar5->crect).x2;
  uVar3 = (pQVar5->crect).y2;
  uVar2 = (pQVar5->crect).x1;
  uVar4 = (pQVar5->crect).y1;
  iVar8 = uVar1 - uVar2;
  iVar9 = uVar3 - uVar4;
  iVar7 = iVar9 + -1;
  pQVar6 = QWidget::palette(&this->super_QWidget);
  QPalette::brush((ColorGroup)pQVar6,Dark);
  QPainter::setPen((QColor *)&local_58);
  local_38 = 0;
  iStack_34 = iVar7;
  iStack_30 = iVar8 + -1;
  iStack_2c = iVar7;
  QPainter::drawLines((QLine *)&local_58,(int)&local_38);
  QPalette::brush((ColorGroup)pQVar6,Dark);
  QPainter::setPen((QColor *)&local_58);
  local_38 = iVar8;
  iStack_34 = iVar7;
  QPainter::drawPoints((QPoint *)&local_58,(int)&local_38);
  local_38 = 0;
  iStack_34 = iVar9;
  iStack_30 = iVar8;
  iStack_2c = iVar9;
  QPainter::drawLines((QLine *)&local_58,(int)&local_38);
  QPainter::~QPainter((QPainter *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardHeader::paintEvent(QPaintEvent * /* event */)
{
    QStylePainter painter(this);
    painter.drawPixmap(0, 0, bannerPixmap);

    int x = width() - 2;
    int y = height() - 2;
    const QPalette &pal = palette();
    painter.setPen(pal.mid().color());
    painter.drawLine(0, y, x, y);
    painter.setPen(pal.base().color());
    painter.drawPoint(x + 1, y);
    painter.drawLine(0, y + 1, x + 1, y + 1);
}